

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O1

void update(float dt)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  cgltf_animation *pcVar4;
  cgltf_accessor *pcVar5;
  ulong uVar6;
  cgltf_size cVar7;
  cgltf_animation_channel *pcVar8;
  cgltf_animation_sampler *sampler;
  ulong uVar9;
  float *pfVar10;
  void *pvVar11;
  cgltf_accessor *pcVar12;
  cgltf_size cVar13;
  bool bVar14;
  long lVar15;
  i32 numKeys;
  long lVar16;
  char *__function;
  ulong uVar17;
  ulong uVar18;
  cgltf_node *node;
  cgltf_node *node_00;
  long lVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  long lVar24;
  undefined8 *puVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  vec<3,_float,_(glm::qualifier)0> vVar35;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 local_70;
  undefined8 local_6c;
  undefined8 uStack_64;
  undefined4 local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined8 local_44;
  undefined8 uStack_3c;
  undefined4 local_34;
  
  uVar9 = DAT_003fb990;
  if (parsedData != (cgltf_data *)0x0) {
    lVar16 = (long)anims::playingInd;
    if (0 < lVar16) {
      pcVar4 = parsedData->animations;
      anims::time = dt + anims::time;
      fVar26 = fmodf(anims::time,anims::duration);
      uVar18 = DAT_003fb990;
      lVar24 = anims::curKeyInds;
      anims::time = fVar26;
      if ((fVar26 < 0.0) || (anims::duration <= fVar26)) {
        __assert_fail("time >= 0 && time < duration",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                      ,0x1eb,"void anims::update(float)");
      }
      if (0 < (int)(uint)uVar9) {
        uVar17 = 0;
LAB_00112d13:
        if (uVar17 != uVar18) {
          pcVar5 = pcVar4[lVar16 + -1].samplers[uVar17].input;
          uVar6 = pcVar5->count;
          iVar21 = *(int *)(lVar24 + uVar17 * 4);
          do {
            uVar23 = (ulong)iVar21;
LAB_00112d37:
            if (iVar21 == -1) {
              if (uVar6 == 0) goto LAB_00113384;
              fVar33 = *(float *)((long)pcVar5->buffer_view->buffer->data +
                                 pcVar5->offset + pcVar5->buffer_view->offset);
              bVar14 = fVar33 <= fVar26;
              if (fVar26 < fVar33) goto LAB_00112da2;
              iVar21 = 0;
              goto LAB_00112e11;
            }
            if (iVar21 == (int)uVar6 + -1) {
              if (uVar6 <= uVar23) goto LAB_00113384;
              bVar14 = fVar26 < *(float *)((long)pcVar5->buffer_view->buffer->data +
                                          pcVar5->stride * uVar23 +
                                          pcVar5->offset + pcVar5->buffer_view->offset);
              if (!bVar14) goto LAB_00112da2;
              iVar21 = -1;
            }
            else {
              if (uVar6 <= uVar23) goto LAB_00113384;
              iVar22 = iVar21 + 1;
              if (uVar6 <= (ulong)(long)iVar22) goto LAB_00113384;
              pvVar11 = pcVar5->buffer_view->buffer->data;
              lVar15 = pcVar5->offset + pcVar5->buffer_view->offset;
              iVar21 = -1;
              if ((*(float *)((long)pvVar11 + uVar23 * pcVar5->stride + lVar15) <= fVar26) &&
                 (iVar21 = iVar22,
                 fVar26 < *(float *)((long)pvVar11 + pcVar5->stride * (long)iVar22 + lVar15)))
              goto LAB_00112e1d;
            }
LAB_00112e11:
            *(int *)(lVar24 + uVar17 * 4) = iVar21;
          } while( true );
        }
        goto LAB_001133a3;
      }
LAB_00112e29:
      cVar7 = pcVar4[lVar16 + -1].channels_count;
      if (cVar7 != 0) {
        pcVar8 = pcVar4[lVar16 + -1].channels;
        lVar24 = 0;
        do {
          sampler = *(cgltf_animation_sampler **)((long)&pcVar8->sampler + lVar24);
          lVar15 = (long)sampler - (long)pcVar4[lVar16 + -1].samplers >> 3;
          if (DAT_003fb990 <= (ulong)(lVar15 * -0x3333333333333333)) {
LAB_001133a3:
            __function = "T &tl::Vector<int>::operator[](size_t) [T = int]";
LAB_001133cf:
            __assert_fail("i < _size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/tl/tl/containers/vector.hpp"
                          ,0x2c,__function);
          }
          lVar19 = *(long *)((long)&pcVar8->target_node + lVar24) - (long)parsedData->nodes >> 3;
          uVar17 = lVar19 * -0x7b425ed097b425ed;
          iVar21 = *(int *)(anims::curKeyInds + lVar15 * 0x3333333333333334);
          uVar18 = (ulong)iVar21;
          pcVar5 = sampler->input;
          uVar9 = pcVar5->count;
          iVar22 = *(int *)((long)&pcVar8->target_path + lVar24);
          numKeys = (i32)uVar9;
          if (iVar22 != 3) {
            if (iVar22 == 2) {
              if (uVar17 < DAT_003fb948) {
                pfVar10 = *(float **)(anims::nodesData + 8 + lVar19 * 0x71c71c71c71c71c8);
                if (pfVar10 == (float *)0x0) {
                  __assert_fail("&rot",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                                ,0x226,"void anims::update(float)");
                }
                if (sampler->interpolation == cgltf_interpolation_type_linear) {
                  if (iVar21 == -1) {
                    pcVar5 = sampler->output;
                    if (pcVar5->count == 0) goto LAB_00113384;
                    pvVar11 = pcVar5->buffer_view->buffer->data;
                    cVar13 = pcVar5->buffer_view->offset;
                    uVar3 = *(undefined8 *)((long)pvVar11 + pcVar5->offset + cVar13);
                    fVar30 = (float)uVar3;
                    fVar34 = (float)((ulong)uVar3 >> 0x20);
                    uVar3 = *(undefined8 *)((long)pvVar11 + pcVar5->offset + 8 + cVar13);
                    fVar26 = (float)uVar3;
                    fVar33 = (float)((ulong)uVar3 >> 0x20);
                  }
                  else {
                    iVar22 = numKeys + -1;
                    pcVar12 = sampler->output;
                    uVar17 = pcVar12->count;
                    if (iVar22 == iVar21) {
                      if (uVar17 <= (ulong)(long)iVar22) goto LAB_00113384;
                      pvVar11 = pcVar12->buffer_view->buffer->data;
                      lVar15 = pcVar12->offset + pcVar12->buffer_view->offset;
                      lVar19 = (long)iVar22 * pcVar12->stride;
                      uVar3 = *(undefined8 *)((long)pvVar11 + lVar19 + lVar15);
                      fVar30 = (float)uVar3;
                      fVar34 = (float)((ulong)uVar3 >> 0x20);
                      uVar3 = *(undefined8 *)((long)pvVar11 + lVar19 + 8 + lVar15);
                      fVar26 = (float)uVar3;
                      fVar33 = (float)((ulong)uVar3 >> 0x20);
                    }
                    else {
                      if ((((uVar17 <= uVar18) || (uVar6 = uVar18 + 1, uVar17 <= uVar6)) ||
                          (uVar9 <= uVar18)) || (uVar9 <= uVar6)) {
LAB_00113384:
                        __assert_fail("i < a.count",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/utils.hpp"
                                      ,0x54,
                                      "const void *cgltfAccessAccessor(const cgltf_accessor &, cgltf_size)"
                                     );
                      }
                      pvVar11 = pcVar12->buffer_view->buffer->data;
                      lVar15 = pcVar12->offset + pcVar12->buffer_view->offset;
                      lVar20 = pcVar12->stride * uVar18;
                      lVar19 = pcVar12->stride * uVar6;
                      fVar33 = *(float *)((long)pvVar11 + lVar20 + lVar15 + 0xc);
                      fVar34 = *(float *)((long)pvVar11 + lVar20 + lVar15);
                      fVar1 = *(float *)((long)pvVar11 + lVar20 + lVar15 + 4);
                      fVar2 = *(float *)((long)pvVar11 + lVar20 + lVar15 + 8);
                      fVar30 = *(float *)((long)pvVar11 + lVar19 + lVar15 + 0xc);
                      fVar31 = *(float *)((long)pvVar11 + lVar19 + lVar15);
                      fVar32 = *(float *)((long)pvVar11 + lVar19 + lVar15 + 4);
                      fVar29 = *(float *)((long)pvVar11 + lVar19 + lVar15 + 8);
                      fVar26 = fVar2 * fVar29 + fVar1 * fVar32 + fVar34 * fVar31 + fVar33 * fVar30;
                      if (0.0 <= fVar26) {
                        uVar3 = *(undefined8 *)((long)pvVar11 + lVar19 + lVar15);
                        fVar31 = (float)uVar3;
                        fVar32 = (float)((ulong)uVar3 >> 0x20);
                        uVar3 = *(undefined8 *)((long)pvVar11 + lVar19 + lVar15 + 8);
                        fVar29 = (float)uVar3;
                        fVar30 = (float)((ulong)uVar3 >> 0x20);
                      }
                      else {
                        fVar31 = -fVar31;
                        fVar32 = -fVar32;
                        fVar29 = -fVar29;
                        fVar30 = -fVar30;
                        fVar26 = -fVar26;
                      }
                      pvVar11 = pcVar5->buffer_view->buffer->data;
                      lVar15 = pcVar5->offset + pcVar5->buffer_view->offset;
                      fVar27 = *(float *)((long)pvVar11 + uVar18 * pcVar5->stride + lVar15);
                      fVar28 = (anims::time - fVar27) /
                               (*(float *)((long)pvVar11 + uVar6 * pcVar5->stride + lVar15) - fVar27
                               );
                      fVar27 = 1.0 - fVar28;
                      if (fVar26 <= 0.9999999) {
                        fVar26 = acosf(fVar26);
                        fVar27 = sinf(fVar27 * fVar26);
                        fVar28 = sinf(fVar28 * fVar26);
                        fVar26 = sinf(fVar26);
                        fVar33 = (fVar30 * fVar28 + fVar33 * fVar27) / fVar26;
                        fVar30 = (fVar31 * fVar28 + fVar34 * fVar27) / fVar26;
                        fVar34 = (fVar32 * fVar28 + fVar1 * fVar27) / fVar26;
                        fVar26 = (fVar29 * fVar28 + fVar2 * fVar27) / fVar26;
                      }
                      else {
                        fVar33 = fVar33 * fVar27 + fVar30 * fVar28;
                        fVar30 = fVar34 * fVar27 + fVar28 * fVar31;
                        fVar34 = fVar1 * fVar27 + fVar32 * fVar28;
                        fVar26 = fVar2 * fVar27 + fVar28 * fVar29;
                      }
                    }
                  }
                }
                else {
                  if (sampler->interpolation != cgltf_interpolation_type_step) {
                    __assert_fail("false && \"not implemented\"",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                                  ,0x1dc,
                                  "T anims::interpolateAnim(cgltf_interpolation_type, const cgltf_animation_sampler &, i32, i32) [T = glm::qua<float>]"
                                 );
                  }
                  if (iVar21 < 1) {
                    iVar21 = 0;
                  }
                  if (numKeys < iVar21) {
                    iVar21 = numKeys;
                  }
                  pcVar5 = sampler->output;
                  if (pcVar5->count <= (ulong)(long)iVar21) goto LAB_00113384;
                  pvVar11 = pcVar5->buffer_view->buffer->data;
                  lVar15 = pcVar5->offset + pcVar5->buffer_view->offset;
                  lVar19 = (long)iVar21 * pcVar5->stride;
                  uVar3 = *(undefined8 *)((long)pvVar11 + lVar19 + lVar15);
                  fVar30 = (float)uVar3;
                  fVar34 = (float)((ulong)uVar3 >> 0x20);
                  uVar3 = *(undefined8 *)((long)pvVar11 + lVar19 + 8 + lVar15);
                  fVar26 = (float)uVar3;
                  fVar33 = (float)((ulong)uVar3 >> 0x20);
                }
                *pfVar10 = fVar30;
                pfVar10[1] = fVar34;
                pfVar10[2] = fVar26;
                pfVar10[3] = fVar33;
                goto LAB_001132cf;
              }
            }
            else {
              if (iVar22 != 1) {
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                              ,0x231,"void anims::update(float)");
              }
              if (uVar17 < DAT_003fb948) {
                puVar25 = *(undefined8 **)(anims::nodesData + lVar19 * 0x71c71c71c71c71c8);
                if (puVar25 == (undefined8 *)0x0) {
                  __assert_fail("&pos",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                                ,0x220,"void anims::update(float)");
                }
                goto LAB_00112f97;
              }
            }
LAB_001133ba:
            __function = "T &tl::Vector<anims::NodeData>::operator[](size_t) [T = anims::NodeData]";
            goto LAB_001133cf;
          }
          if (DAT_003fb948 <= uVar17) goto LAB_001133ba;
          puVar25 = *(undefined8 **)(anims::nodesData + 0x10 + lVar19 * 0x71c71c71c71c71c8);
          if (puVar25 == (undefined8 *)0x0) {
            __assert_fail("&scale",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                          ,0x22c,"void anims::update(float)");
          }
LAB_00112f97:
          vVar35 = anims::interpolateAnim<glm::vec<3,float,(glm::qualifier)0>>
                             (sampler->interpolation,sampler,iVar21,numKeys);
          *puVar25 = vVar35._0_8_;
          *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)(puVar25 + 1) =
               vVar35.field_2;
LAB_001132cf:
          lVar24 = lVar24 + 0x28;
        } while (cVar7 * 0x28 != lVar24);
      }
    }
    tl::Vector<glm::mat<4,_4,_float,_(glm::qualifier)0>_>::resize<>
              ((Vector<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *)&anims::nodesMatrices,
               parsedData->nodes_count);
    if (parsedData->nodes_count != 0) {
      node_00 = parsedData->nodes;
      lVar16 = parsedData->nodes_count * 0xd8;
      do {
        if (node_00->parent == (cgltf_node *)0x0) {
          local_70.x = 1.0;
          local_6c = 0;
          uStack_64 = 0;
          local_5c = 0x3f800000;
          local_58 = 0;
          uStack_50 = 0;
          local_48 = 0x3f800000;
          local_44 = 0;
          uStack_3c = 0;
          local_34 = 0x3f800000;
          calcNodesMatricesRecursive(node_00,(mat4 *)&local_70);
        }
        node_00 = node_00 + 1;
        lVar16 = lVar16 + -0xd8;
      } while (lVar16 != 0);
    }
  }
  return;
LAB_00112da2:
  if (!bVar14) {
LAB_00112e1d:
    uVar17 = uVar17 + 1;
    if (uVar17 != ((uint)uVar9 & 0x7fffffff)) goto LAB_00112d13;
    goto LAB_00112e29;
  }
  goto LAB_00112d37;
}

Assistant:

void update(float dt)
{
    if(!parsedData)
        return;

    anims::update(dt);

    anims::nodesMatrices.resize(parsedData->nodes_count);
    for(const cgltf_node& node : getNodes())
        if(node.parent == nullptr)
            calcNodesMatricesRecursive(node);
}